

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::RegrSState,double,double,duckdb::RegrSYYOperation>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  long lVar1;
  long lVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  double dVar6;
  double dVar7;
  long lVar9;
  undefined1 auVar8 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  UnifiedVectorFormat adata;
  UnifiedVectorFormat bdata;
  long *local_b0;
  long local_a8;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long *local_68 [2];
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  if (local_a0 == 0 && local_58 == 0) {
    if (count != 0) {
      dVar7 = *(double *)(state + 0x10);
      dVar6 = *(double *)(state + 0x18);
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        if (*local_b0 != 0) {
          iVar4 = (idx_t)*(uint *)(*local_b0 + iVar3 * 4);
        }
        lVar1 = *(long *)(state + 8) + 1 + iVar3;
        dVar11 = *(double *)(local_a8 + iVar4 * 8);
        dVar10 = dVar11 - dVar7;
        auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar12._0_8_ = lVar1;
        auVar12._12_4_ = 0x45300000;
        dVar7 = dVar7 + dVar10 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
        dVar6 = dVar6 + (dVar11 - dVar7) * dVar10;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
      *(idx_t *)state = *(long *)state + count;
      *(idx_t *)(state + 8) = *(long *)(state + 8) + count;
      *(double *)(state + 0x10) = dVar7;
      *(double *)(state + 0x18) = dVar6;
    }
  }
  else if (count != 0) {
    lVar1 = *local_b0;
    lVar2 = *local_68[0];
    iVar3 = 0;
    do {
      iVar4 = iVar3;
      if (lVar1 != 0) {
        iVar4 = (idx_t)*(uint *)(lVar1 + iVar3 * 4);
      }
      iVar5 = iVar3;
      if (lVar2 != 0) {
        iVar5 = (idx_t)*(uint *)(lVar2 + iVar3 * 4);
      }
      if (((local_a0 == 0) || ((*(ulong *)(local_a0 + (iVar4 >> 6) * 8) >> (iVar4 & 0x3f) & 1) != 0)
          ) && ((local_58 == 0 ||
                ((*(ulong *)(local_58 + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) != 0)))) {
        lVar9 = *(long *)(state + 8) + 1;
        *(long *)state = *(long *)state + 1;
        *(long *)(state + 8) = lVar9;
        dVar7 = *(double *)(local_a8 + iVar4 * 8);
        dVar11 = dVar7 - *(double *)(state + 0x10);
        auVar8._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar8._0_8_ = lVar9;
        auVar8._12_4_ = 0x45300000;
        dVar6 = dVar11 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) +
                *(double *)(state + 0x10);
        *(double *)(state + 0x10) = dVar6;
        *(double *)(state + 0x18) = (dVar7 - dVar6) * dVar11 + *(double *)(state + 0x18);
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}